

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_ComputeSolutions(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  uint uVar1;
  ARKodeARKStepMem step_mem;
  N_Vector p_Var2;
  sunrealtype *psVar3;
  N_Vector *pp_Var4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  sunrealtype sVar12;
  int local_4c;
  N_Vector local_48;
  sunrealtype *local_40;
  N_Vector local_38;
  
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeARKStepMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xc65,"arkStep_ComputeSolutions",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  p_Var2 = ark_mem->ycur;
  local_38 = ark_mem->tempv1;
  psVar3 = step_mem->cvals;
  pp_Var4 = step_mem->Xvecs;
  *dsmPtr = 0.0;
  local_40 = dsmPtr;
  if (step_mem->explicit == 0) {
    if (step_mem->implicit != 0) {
      bVar11 = false;
      local_48 = p_Var2;
      goto LAB_0012686f;
    }
  }
  else {
    local_48 = p_Var2;
    iVar7 = ARKodeButcherTable_IsStifflyAccurate(step_mem->Be);
    bVar11 = iVar7 == 0;
    if (step_mem->implicit == 0) {
      if (iVar7 != 0) goto LAB_001269f5;
    }
    else {
LAB_0012686f:
      iVar7 = ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi);
      if (!(bool)(iVar7 == 0 | bVar11)) goto LAB_001269f5;
    }
    *psVar3 = 1.0;
    *pp_Var4 = ark_mem->yn;
    uVar1 = step_mem->stages;
    uVar10 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    local_4c = 1;
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      if (step_mem->explicit != 0) {
        psVar3[local_4c] = ark_mem->h * step_mem->Be->b[uVar10];
        pp_Var4[local_4c] = step_mem->Fe[uVar10];
        local_4c = local_4c + 1;
      }
      if (step_mem->implicit != 0) {
        psVar3[local_4c] = ark_mem->h * step_mem->Bi->b[uVar10];
        pp_Var4[local_4c] = step_mem->Fi[uVar10];
        local_4c = local_4c + 1;
      }
    }
    lVar9 = 0x70;
    if ((step_mem->expforcing != 0) || (lVar9 = 0x78, step_mem->impforcing != 0)) {
      lVar9 = *(long *)((long)&step_mem->fe + lVar9);
      lVar5 = *(long *)(lVar9 + 0x18);
      lVar9 = *(long *)(lVar9 + 0x20);
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        step_mem->stage_times[uVar10] = *(double *)(lVar5 + uVar10 * 8) * ark_mem->h + ark_mem->tn;
        step_mem->stage_coefs[uVar10] = ark_mem->h * *(double *)(lVar9 + uVar10 * 8);
      }
      arkStep_ApplyForcing(step_mem,step_mem->stage_times,step_mem->stage_coefs,uVar1,&local_4c);
    }
    iVar7 = N_VLinearCombination(local_4c,psVar3,pp_Var4,local_48);
    if (iVar7 != 0) {
      return -0x1c;
    }
  }
LAB_001269f5:
  if ((ark_mem->fixedstep != 0) && (ark_mem->AccumErrorType == ARK_ACCUMERROR_NONE)) {
    return 0;
  }
  uVar1 = step_mem->stages;
  uVar10 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  local_4c = 0;
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    if (step_mem->explicit != 0) {
      psVar3[local_4c] = (step_mem->Be->b[uVar10] - step_mem->Be->d[uVar10]) * ark_mem->h;
      pp_Var4[local_4c] = step_mem->Fe[uVar10];
      local_4c = local_4c + 1;
    }
    if (step_mem->implicit != 0) {
      psVar3[local_4c] = (step_mem->Bi->b[uVar10] - step_mem->Bi->d[uVar10]) * ark_mem->h;
      pp_Var4[local_4c] = step_mem->Fi[uVar10];
      local_4c = local_4c + 1;
    }
  }
  if (step_mem->expforcing == 0) {
    if (step_mem->impforcing == 0) goto LAB_00126b6e;
    lVar9 = 0x78;
  }
  else {
    lVar9 = 0x70;
  }
  lVar9 = *(long *)((long)&step_mem->fe + lVar9);
  lVar5 = *(long *)(lVar9 + 0x28);
  lVar6 = *(long *)(lVar9 + 0x18);
  lVar9 = *(long *)(lVar9 + 0x20);
  for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    step_mem->stage_times[uVar10] = *(double *)(lVar6 + uVar10 * 8) * ark_mem->h + ark_mem->tn;
    step_mem->stage_coefs[uVar10] =
         (*(double *)(lVar9 + uVar10 * 8) - *(double *)(lVar5 + uVar10 * 8)) * ark_mem->h;
  }
  arkStep_ApplyForcing(step_mem,step_mem->stage_times,step_mem->stage_coefs,uVar1,&local_4c);
LAB_00126b6e:
  p_Var2 = local_38;
  iVar7 = N_VLinearCombination(local_4c,psVar3,pp_Var4,local_38);
  if (iVar7 == 0) {
    sVar12 = (sunrealtype)N_VWrmsNorm(p_Var2,ark_mem->ewt);
    *local_40 = sVar12;
    return 0;
  }
  return -0x1c;
}

Assistant:

int arkStep_ComputeSolutions(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunrealtype* cj;
  sunrealtype* bj;
  sunrealtype* dj;
  sunbooleantype stiffly_accurate;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts, and shortcut to time at end of step */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* check if the method is stiffly accurate */
  stiffly_accurate = SUNTRUE;

  if (step_mem->explicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Be))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  if (step_mem->implicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  /* If the method is stiffly accurate, ycur is already the new solution */

  if (!stiffly_accurate)
  {
    /* Compute time step solution (if necessary) */
    /*   set arrays for fused vector operation */
    cvals[0] = ONE;
    Xvecs[0] = ark_mem->yn;
    nvec     = 1;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Be->b[j];
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Bi->b[j];
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      if (step_mem->expforcing)
      {
        cj = step_mem->Be->c;
        bj = step_mem->Be->b;
      }
      else
      {
        cj = step_mem->Bi->c;
        bj = step_mem->Bi->b;
      }

      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h * bj[j];
      }

      arkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /*   call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
  }

  /* Compute yerr (if temporal error estimation is enabled). */
  if (!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE))
  {
    /* set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Be->b[j] - step_mem->Be->d[j]);
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Bi->b[j] - step_mem->Bi->d[j]);
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      if (step_mem->expforcing)
      {
        cj = step_mem->Be->c;
        bj = step_mem->Be->b;
        dj = step_mem->Be->d;
      }
      else
      {
        cj = step_mem->Bi->c;
        bj = step_mem->Bi->b;
        dj = step_mem->Bi->d;
      }

      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h * (bj[j] - dj[j]);
      }

      arkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}